

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.hh
# Opt level: O2

bool tinyusdz::startsWith(string *str,string *t)

{
  char *__first1;
  bool bVar1;
  
  if (str->_M_string_length < t->_M_string_length) {
    return false;
  }
  __first1 = (t->_M_dataplus)._M_p;
  bVar1 = ::std::__equal<true>::equal<char>
                    (__first1,__first1 + t->_M_string_length,(str->_M_dataplus)._M_p);
  return bVar1;
}

Assistant:

inline bool startsWith(const std::string &str, const std::string &t) {
  return (str.size() >= t.size()) &&
         std::equal(std::begin(t), std::end(t), std::begin(str));
}